

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::addSwitchBreak(Builder *this,bool implicit)

{
  reference ppBVar1;
  bool implicit_local;
  Builder *this_local;
  
  ppBVar1 = std::stack<spv::Block_*,_std::deque<spv::Block_*,_std::allocator<spv::Block_*>_>_>::top
                      (&this->switchMerges);
  createBranch(this,implicit,*ppBVar1);
  createAndSetNoPredecessorBlock(this,"post-switch-break");
  return;
}

Assistant:

void Builder::addSwitchBreak(bool implicit)
{
    // branch to the top of the merge block stack
    createBranch(implicit, switchMerges.top());
    createAndSetNoPredecessorBlock("post-switch-break");
}